

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O2

string * amrex::VisMF::DirName(string *__return_storage_ptr__,string *filename)

{
  char *__s;
  int iVar1;
  char *pcVar2;
  size_t __n;
  long lVar3;
  allocator local_2a;
  allocator local_29;
  
  if (DirName(std::__cxx11::string_const&)::TheNullString_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&DirName(std::__cxx11::string_const&)::TheNullString_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string
                ((string *)&DirName(std::__cxx11::string_const&)::TheNullString_abi_cxx11_,"",
                 &local_29);
      __cxa_atexit(std::__cxx11::string::~string,
                   &DirName(std::__cxx11::string_const&)::TheNullString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&DirName(std::__cxx11::string_const&)::TheNullString_abi_cxx11_);
    }
  }
  __s = (filename->_M_dataplus)._M_p;
  pcVar2 = strrchr(__s,0x2f);
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)&DirName(std::__cxx11::string_const&)::TheNullString_abi_cxx11_);
  }
  else {
    lVar3 = (ulong)(uint)((int)pcVar2 - (int)__s) << 0x20;
    pcVar2 = (char *)operator_new__(lVar3 + 0x200000000 >> 0x20);
    __n = lVar3 + 0x100000000 >> 0x20;
    strncpy(pcVar2,__s,__n);
    pcVar2[__n] = '\0';
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_2a);
    operator_delete__(pcVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
VisMF::DirName (const std::string& filename)
{
    BL_ASSERT(filename[filename.length() - 1] != '/');

    static const std::string TheNullString("");

    const char *str = filename.c_str();

    if(const char *slash = strrchr(str, '/')) {
        //
        // Got at least one slash -- return the dirname including last slash.
        //
        int len((slash - str) + 1);

        char *buf = new char[len+1];

        strncpy(buf, str, len);

        buf[len] = 0;   // Stringify

        std::string dirname = buf;

        delete [] buf;

        return dirname;
    } else {
        //
        // No directory name here.
        //
        return TheNullString;
    }
}